

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btMultiBodyDynamicsWorld::solveConstraints
          (btMultiBodyDynamicsWorld *this,btContactSolverInfo *solverInfo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btTypedConstraint *pbVar5;
  btMultiBodyConstraint *pbVar6;
  btConstraintSolver *pbVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  btTypedConstraint **ppbVar14;
  btMultiBodyConstraint **ppbVar15;
  char *name;
  btCollisionWorld *pbVar16;
  btDispatcher *pbVar17;
  btMultibodyLink *pbVar18;
  btMultiBodyLinkCollider *pbVar19;
  btCollisionObject *pbVar20;
  btMultibodyLink *pbVar21;
  btQuadWord *pbVar22;
  btScalar *pbVar23;
  btVector3 *pbVar24;
  float *pfVar25;
  btMultiBody **ppbVar26;
  long lVar27;
  long in_RSI;
  btDiscreteDynamicsWorld *in_RDI;
  float fVar28;
  btMultiBody *bod_2;
  int i_5;
  bool isConstraintPass;
  int b_1;
  bool isSleeping_1;
  btMultiBody *bod_1;
  int i_4;
  CProfileSample __profile_2;
  int link_1;
  int i_3;
  btScalar *pRealBuf;
  int i_2;
  btAlignedObjectArray<float> delta_qd;
  btAlignedObjectArray<float> delta_q;
  btScalar h;
  anon_struct_1_0_00000001 pCopy;
  anon_struct_1_0_00000001 pCopyToVelocityVector;
  anon_struct_1_0_00000001 pEulerIntegrate;
  anon_struct_24_3_4afc6ef8 pResetQx;
  int dof_1;
  int dof;
  int link;
  btScalar *scratch_qdd3;
  btScalar *scratch_qdd2;
  btScalar *scratch_qdd1;
  btScalar *scratch_qdd0;
  btScalar *scratch_qd3;
  btScalar *scratch_qd2;
  btScalar *scratch_qd1;
  btScalar *scratch_qd0;
  btScalar *scratch_qx;
  btScalar *scratch_q0;
  btScalar *pMem;
  btAlignedObjectArray<float> scratch_r2;
  int numPosVars;
  int numDofs;
  bool doNotUpdatePos;
  int b;
  bool isSleeping;
  btMultiBody *bod;
  int i_1;
  CProfileSample __profile_1;
  btMultiBodyConstraint **sortedMultiBodyConstraints;
  btTypedConstraint **constraintsPtr;
  int i;
  CProfileSample __profile;
  btAlignedObjectArray<btMatrix3x3> scratch_m;
  btAlignedObjectArray<btVector3> scratch_v;
  btAlignedObjectArray<float> scratch_r;
  undefined1 in_stack_00000717;
  btAlignedObjectArray<btMatrix3x3> *in_stack_00000718;
  btAlignedObjectArray<btVector3> *in_stack_00000720;
  btAlignedObjectArray<float> *in_stack_00000728;
  btScalar in_stack_00000734;
  btMultiBody *in_stack_00000738;
  char *in_stack_fffffffffffffa08;
  btMultiBody *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  btScalar in_stack_fffffffffffffa24;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  int in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa34;
  int in_stack_fffffffffffffa3c;
  btTypedConstraint **in_stack_fffffffffffffa40;
  btContactSolverInfo *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  btIDebugDraw *in_stack_fffffffffffffa60;
  btMultiBodyDynamicsWorld *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffad0;
  float in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffb18;
  btScalar *in_stack_fffffffffffffb20;
  btScalar in_stack_fffffffffffffb2c;
  btMultiBody *in_stack_fffffffffffffb30;
  IslandCallback *in_stack_fffffffffffffb38;
  btCollisionWorld *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  btSimulationIslandManager *in_stack_fffffffffffffb50;
  btMultiBodyConstraint **local_338;
  btTypedConstraint **local_2f0;
  int local_294;
  btVector3 local_25c;
  undefined4 local_24c;
  int local_248;
  byte local_241;
  btMultiBody *local_240;
  int local_238;
  int local_230;
  int local_22c;
  btScalar *local_228;
  int local_220;
  undefined4 local_21c;
  btAlignedObjectArray<float> local_218;
  undefined4 local_1f4;
  btAlignedObjectArray<float> local_1f0;
  float local_1d0;
  anon_struct_1_0_00000001 local_1cb [2];
  anon_struct_1_0_00000001 local_1c9;
  btMultiBody *local_1c8;
  btScalar *local_1c0;
  btMultiBody *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  btScalar *local_1a0;
  btScalar *local_198;
  btScalar *local_190;
  btScalar *local_188;
  btScalar *local_180;
  btScalar *local_178;
  btScalar *local_170;
  btScalar *local_168;
  btScalar *local_160;
  btMultiBody *local_158;
  btScalar *local_150;
  undefined4 local_144;
  btAlignedObjectArray<float> local_140;
  int local_120;
  int local_11c;
  byte local_115;
  btVector3 local_e4;
  undefined4 local_d4;
  int local_d0;
  byte local_c9;
  btMultiBody *local_c8;
  int local_c0;
  btMultiBodyConstraint **local_b8;
  undefined8 local_a8;
  btTypedConstraint **local_a0;
  int local_94;
  undefined8 local_90;
  btAlignedObjectArray<float> local_30;
  long local_10;
  undefined4 extraout_var;
  
  local_10 = in_RSI;
  forwardKinematics(in_stack_fffffffffffffa70);
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)in_stack_fffffffffffffa10);
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffa10);
  btAlignedObjectArray<btMatrix3x3>::btAlignedObjectArray
            ((btAlignedObjectArray<btMatrix3x3> *)in_stack_fffffffffffffa10);
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  btAlignedObjectArray<btTypedConstraint_*>::size(&in_RDI->m_constraints);
  local_90 = 0;
  btAlignedObjectArray<btTypedConstraint_*>::resize
            ((btAlignedObjectArray<btTypedConstraint_*> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),in_stack_fffffffffffffa2c
             ,(btTypedConstraint **)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  for (local_94 = 0; iVar10 = local_94,
      iVar9 = (*(in_RDI->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[0x1a])
                        (), iVar10 < iVar9; local_94 = local_94 + 1) {
    ppbVar14 = btAlignedObjectArray<btTypedConstraint_*>::operator[]
                         (&in_RDI->m_constraints,local_94);
    pbVar5 = *ppbVar14;
    ppbVar14 = btAlignedObjectArray<btTypedConstraint_*>::operator[]
                         (&in_RDI->m_sortedConstraints,local_94);
    *ppbVar14 = pbVar5;
  }
  btAlignedObjectArray<btTypedConstraint_*>::quickSort<btSortConstraintOnIslandPredicate2>
            ((btAlignedObjectArray<btTypedConstraint_*> *)
             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
             (btSortConstraintOnIslandPredicate2 *)
             CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  iVar10 = (*(in_RDI->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[0x1a])();
  if (iVar10 == 0) {
    local_2f0 = (btTypedConstraint **)0x0;
  }
  else {
    local_2f0 = btAlignedObjectArray<btTypedConstraint_*>::operator[]
                          (&in_RDI->m_sortedConstraints,0);
  }
  local_a0 = local_2f0;
  btAlignedObjectArray<btMultiBodyConstraint_*>::size
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
             &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_collisionObjects.m_ownsMemory
            );
  local_a8 = 0;
  btAlignedObjectArray<btMultiBodyConstraint_*>::resize
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),in_stack_fffffffffffffa2c
             ,(btMultiBodyConstraint **)
              CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  for (local_94 = 0; iVar10 = local_94,
      iVar9 = btAlignedObjectArray<btMultiBodyConstraint_*>::size
                        ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                         &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_collisionObjects.
                          m_ownsMemory), iVar10 < iVar9; local_94 = local_94 + 1) {
    ppbVar15 = btAlignedObjectArray<btMultiBodyConstraint_*>::operator[]
                         ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                          &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_collisionObjects
                           .m_ownsMemory,local_94);
    pbVar6 = *ppbVar15;
    ppbVar15 = btAlignedObjectArray<btMultiBodyConstraint_*>::operator[]
                         ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                          &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_dispatchInfo.
                           m_useContinuous,local_94);
    *ppbVar15 = pbVar6;
  }
  btAlignedObjectArray<btMultiBodyConstraint_*>::
  quickSort<btSortMultiBodyConstraintOnIslandPredicate>
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
             (btSortMultiBodyConstraintOnIslandPredicate *)
             CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  iVar10 = btAlignedObjectArray<btMultiBodyConstraint_*>::size
                     ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                      &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_dispatchInfo.
                       m_useContinuous);
  if (iVar10 == 0) {
    local_338 = (btMultiBodyConstraint **)0x0;
  }
  else {
    local_338 = btAlignedObjectArray<btMultiBodyConstraint_*>::operator[]
                          ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                           &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_dispatchInfo.
                            m_useContinuous,0);
  }
  local_b8 = local_338;
  btAlignedObjectArray<btTypedConstraint_*>::size(&in_RDI->m_sortedConstraints);
  btAlignedObjectArray<btMultiBodyConstraint_*>::size
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
             &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_dispatchInfo.m_useContinuous)
  ;
  iVar10 = (*(in_RDI->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[5])();
  name = (char *)CONCAT44(extraout_var,iVar10);
  MultiBodyInplaceSolverIslandCallback::setup
            ((MultiBodyInplaceSolverIslandCallback *)
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),in_stack_fffffffffffffa48
             ,in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
             (btMultiBodyConstraint **)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30)
             ,in_stack_fffffffffffffa2c,in_stack_fffffffffffffa60);
  pbVar7 = in_RDI->m_constraintSolver;
  btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  uVar11 = btCollisionWorld::getNumCollisionObjects((btCollisionWorld *)0x24e0aa);
  pbVar16 = btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  pbVar17 = btCollisionWorld::getDispatcher(pbVar16);
  uVar12 = (*pbVar17->_vptr_btDispatcher[9])();
  (*pbVar7->_vptr_btConstraintSolver[2])(pbVar7,(ulong)uVar11,(ulong)uVar12);
  pbVar16 = btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  btCollisionWorld::getDispatcher(pbVar16);
  btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  btSimulationIslandManager::buildAndProcessIslands
            (in_stack_fffffffffffffb50,
             (btDispatcher *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  CProfileSample::CProfileSample((CProfileSample *)in_stack_fffffffffffffa10,name);
  for (local_c0 = 0; iVar10 = local_c0,
      iVar9 = btAlignedObjectArray<btMultiBody_*>::size
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1)), iVar10 < iVar9;
      local_c0 = local_c0 + 1) {
    pbVar18 = (btMultibodyLink *)
              btAlignedObjectArray<btMultiBody_*>::operator[]
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1),local_c0);
    local_c8 = *(btMultiBody **)pbVar18;
    local_c9 = 0;
    pbVar19 = btMultiBody::getBaseCollider(local_c8);
    if (pbVar19 != (btMultiBodyLinkCollider *)0x0) {
      pbVar20 = (btCollisionObject *)btMultiBody::getBaseCollider(local_c8);
      iVar10 = btCollisionObject::getActivationState(pbVar20);
      if (iVar10 == 2) {
        local_c9 = 1;
      }
    }
    for (local_d0 = 0; iVar10 = local_d0, iVar9 = btMultiBody::getNumLinks((btMultiBody *)0x24e2e7),
        iVar10 < iVar9; local_d0 = local_d0 + 1) {
      pbVar21 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
      if (pbVar21->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar21 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
        iVar10 = btCollisionObject::getActivationState((btCollisionObject *)pbVar21->m_collider);
        if (iVar10 == 2) {
          local_c9 = 1;
        }
      }
    }
    if ((local_c9 & 1) == 0) {
      btMultiBody::getNumLinks((btMultiBody *)0x24e3b8);
      local_d4 = 0;
      btAlignedObjectArray<float>::resize
                ((btAlignedObjectArray<float> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,
                 (float *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      btMultiBody::getNumLinks((btMultiBody *)0x24e3f9);
      btVector3::btVector3(&local_e4);
      btAlignedObjectArray<btVector3>::resize
                ((btAlignedObjectArray<btVector3> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      btMultiBody::getNumLinks((btMultiBody *)0x24e44c);
      btMatrix3x3::btMatrix3x3
                ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      btAlignedObjectArray<btMatrix3x3>::resize
                ((btAlignedObjectArray<btMatrix3x3> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,
                 (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      local_115 = 0;
      bVar8 = btMultiBody::isUsingRK4Integration(local_c8);
      if (bVar8) {
        local_11c = btMultiBody::getNumDofs(local_c8);
        local_11c = local_11c + 6;
        local_120 = btMultiBody::getNumPosVars(local_c8);
        local_120 = local_120 + 7;
        btAlignedObjectArray<float>::btAlignedObjectArray
                  ((btAlignedObjectArray<float> *)in_stack_fffffffffffffa10);
        local_144 = 0;
        btAlignedObjectArray<float>::resize
                  ((btAlignedObjectArray<float> *)
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   in_stack_fffffffffffffa2c,
                   (float *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        local_158 = (btMultiBody *)btAlignedObjectArray<float>::operator[](&local_140,0);
        local_160 = (local_158->m_basePos).m_floats + (long)local_120 + -6;
        local_168 = local_160 + local_120;
        local_170 = local_168 + local_11c;
        local_178 = local_170 + local_11c;
        local_180 = local_178 + local_11c;
        local_188 = local_180 + local_11c;
        local_190 = local_188 + local_11c;
        local_198 = local_190 + local_11c;
        local_1a0 = local_198 + local_11c;
        local_150 = local_1a0 + local_11c;
        pbVar22 = &btMultiBody::getWorldToBaseRot(local_c8)->super_btQuadWord;
        pbVar23 = btQuadWord::x(pbVar22);
        *(btScalar *)&local_158->_vptr_btMultiBody = *pbVar23;
        pbVar22 = &btMultiBody::getWorldToBaseRot(local_c8)->super_btQuadWord;
        pbVar23 = btQuadWord::y(pbVar22);
        *(btScalar *)((long)&local_158->_vptr_btMultiBody + 4) = *pbVar23;
        pbVar22 = &btMultiBody::getWorldToBaseRot(local_c8)->super_btQuadWord;
        pbVar23 = btQuadWord::z(pbVar22);
        *(btScalar *)&local_158->m_baseCollider = *pbVar23;
        pbVar22 = &btMultiBody::getWorldToBaseRot(local_c8)->super_btQuadWord;
        pbVar23 = btQuadWord::w(pbVar22);
        *(btScalar *)((long)&local_158->m_baseCollider + 4) = *pbVar23;
        pbVar24 = btMultiBody::getBasePos(local_c8);
        pbVar23 = btVector3::x(pbVar24);
        *(btScalar *)&local_158->m_baseName = *pbVar23;
        pbVar24 = btMultiBody::getBasePos(local_c8);
        pbVar23 = btVector3::y(pbVar24);
        *(btScalar *)((long)&local_158->m_baseName + 4) = *pbVar23;
        pbVar24 = btMultiBody::getBasePos(local_c8);
        pbVar23 = btVector3::z(pbVar24);
        (local_158->m_basePos).m_floats[0] = *pbVar23;
        for (local_1a4 = 0; iVar10 = local_1a4,
            iVar9 = btMultiBody::getNumLinks((btMultiBody *)0x24e987), iVar10 < iVar9;
            local_1a4 = local_1a4 + 1) {
          local_1a8 = 0;
          while (iVar10 = local_1a8,
                pbVar21 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20))
                , iVar10 < pbVar21->m_posVarCount) {
            pbVar21 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
            in_stack_fffffffffffffb2c = pbVar21->m_jointPos[local_1a8];
            in_stack_fffffffffffffb30 = local_158;
            pbVar21 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
            (in_stack_fffffffffffffb30->m_basePos).m_floats
            [(long)(pbVar21->m_cfgOffset + 7 + local_1a8) + -6] = in_stack_fffffffffffffb2c;
            local_1a8 = local_1a8 + 1;
          }
        }
        for (local_1ac = 0; local_1ac < local_11c; local_1ac = local_1ac + 1) {
          in_stack_fffffffffffffb20 = btMultiBody::getVelocityVector((btMultiBody *)0x24eb06);
          local_168[local_1ac] = in_stack_fffffffffffffb20[local_1ac];
        }
        local_1c8 = local_c8;
        local_1c0 = local_160;
        local_1b8 = local_158;
        local_1d0 = *(float *)(local_10 + 0xc);
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
        iVar10 = btMultiBody::getNumDofs(local_c8);
        pfVar25 = btAlignedObjectArray<float>::operator[](&local_30,iVar10);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (local_1cb,pfVar25,local_188,0,local_11c);
        solveConstraints::anon_struct_24_3_4afc6ef8::operator()
                  ((anon_struct_24_3_4afc6ef8 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        btMultiBody::stepPositionsMultiDof
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
                   (btScalar *)CONCAT44(iVar10,in_stack_fffffffffffffb18));
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (&local_1c9,local_1d0 * 0.5,local_188,local_168,local_170,local_11c);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (btMultiBody *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   (btScalar *)in_stack_fffffffffffffa10);
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
        iVar9 = btMultiBody::getNumDofs(local_c8);
        pfVar25 = btAlignedObjectArray<float>::operator[](&local_30,iVar9);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (local_1cb,pfVar25,local_190,0,local_11c);
        solveConstraints::anon_struct_24_3_4afc6ef8::operator()
                  ((anon_struct_24_3_4afc6ef8 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        btMultiBody::stepPositionsMultiDof
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
                   (btScalar *)CONCAT44(iVar10,in_stack_fffffffffffffb18));
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (&local_1c9,local_1d0 * 0.5,local_190,local_168,local_178,local_11c);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (btMultiBody *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   (btScalar *)in_stack_fffffffffffffa10);
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
        iVar9 = btMultiBody::getNumDofs(local_c8);
        pfVar25 = btAlignedObjectArray<float>::operator[](&local_30,iVar9);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (local_1cb,pfVar25,local_198,0,local_11c);
        solveConstraints::anon_struct_24_3_4afc6ef8::operator()
                  ((anon_struct_24_3_4afc6ef8 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        btMultiBody::stepPositionsMultiDof
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
                   (btScalar *)CONCAT44(iVar10,in_stack_fffffffffffffb18));
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (&local_1c9,local_1d0,local_198,local_168,local_180,local_11c);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (btMultiBody *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   (btScalar *)in_stack_fffffffffffffa10);
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
        iVar10 = btMultiBody::getNumDofs(local_c8);
        pfVar25 = btAlignedObjectArray<float>::operator[](&local_30,iVar10);
        solveConstraints::anon_struct_1_0_00000001::operator()
                  (local_1cb,pfVar25,local_1a0,0,local_11c);
        btAlignedObjectArray<float>::btAlignedObjectArray
                  ((btAlignedObjectArray<float> *)in_stack_fffffffffffffa10);
        local_1f4 = 0;
        btAlignedObjectArray<float>::resize
                  ((btAlignedObjectArray<float> *)
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   in_stack_fffffffffffffa2c,
                   (float *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        btAlignedObjectArray<float>::btAlignedObjectArray
                  ((btAlignedObjectArray<float> *)in_stack_fffffffffffffa10);
        local_21c = 0;
        btAlignedObjectArray<float>::resize
                  ((btAlignedObjectArray<float> *)
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   in_stack_fffffffffffffa2c,
                   (float *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        for (local_220 = 0; local_220 < local_11c; local_220 = local_220 + 1) {
          lVar27 = (long)local_220;
          in_stack_fffffffffffffad4 =
               (local_1d0 / 6.0) *
               (local_178[lVar27] + local_178[lVar27] +
                local_170[lVar27] + local_170[lVar27] + local_168[lVar27] + local_180[lVar27]);
          pfVar25 = btAlignedObjectArray<float>::operator[](&local_1f0,local_220);
          *pfVar25 = in_stack_fffffffffffffad4;
          fVar28 = local_1d0 / 6.0;
          lVar27 = (long)local_220;
          fVar1 = local_188[lVar27];
          fVar2 = local_190[lVar27];
          fVar3 = local_198[lVar27];
          fVar4 = local_1a0[lVar27];
          pfVar25 = btAlignedObjectArray<float>::operator[](&local_218,local_220);
          *pfVar25 = fVar28 * (fVar3 + fVar3 + fVar2 + fVar2 + fVar1 + fVar4);
        }
        solveConstraints::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (btMultiBody *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   (btScalar *)in_stack_fffffffffffffa10);
        btAlignedObjectArray<float>::operator[](&local_218,0);
        btMultiBody::applyDeltaVeeMultiDof
                  ((btMultiBody *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   (btScalar *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                   in_stack_fffffffffffffa24);
        if ((local_115 & 1) == 0) {
          local_228 = btMultiBody::getVelocityVector((btMultiBody *)0x24f23b);
          iVar10 = btMultiBody::getNumDofs(local_c8);
          iVar9 = btMultiBody::getNumDofs(local_c8);
          iVar13 = btMultiBody::getNumDofs(local_c8);
          local_228 = local_228 + (iVar10 + 6 + iVar9 * iVar13);
          for (local_22c = 0; local_22c < local_11c; local_22c = local_22c + 1) {
            pfVar25 = btAlignedObjectArray<float>::operator[](&local_1f0,local_22c);
            local_228[local_22c] = *pfVar25;
          }
          btMultiBody::setPosUpdated(local_c8,true);
        }
        for (local_230 = 0; iVar10 = local_230,
            iVar9 = btMultiBody::getNumLinks((btMultiBody *)0x24f385), iVar10 < iVar9;
            local_230 = local_230 + 1) {
          btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
          btMultibodyLink::updateCacheMultiDof(pbVar18,(btScalar *)pbVar19);
        }
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
        btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x24f41a);
        btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x24f427);
        btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x24f434);
      }
      else {
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
      }
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x24f47c);
  (*(in_RDI->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[0x38])();
  MultiBodyInplaceSolverIslandCallback::processConstraints
            ((MultiBodyInplaceSolverIslandCallback *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  (*in_RDI->m_constraintSolver->_vptr_btConstraintSolver[4])
            (in_RDI->m_constraintSolver,local_10,
             (in_RDI->super_btDynamicsWorld).super_btCollisionWorld.m_debugDrawer);
  CProfileSample::CProfileSample((CProfileSample *)in_stack_fffffffffffffa10,name);
  for (local_238 = 0; iVar10 = local_238,
      iVar9 = btAlignedObjectArray<btMultiBody_*>::size
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1)), iVar10 < iVar9;
      local_238 = local_238 + 1) {
    ppbVar26 = btAlignedObjectArray<btMultiBody_*>::operator[]
                         ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1),local_238);
    local_240 = *ppbVar26;
    local_241 = 0;
    pbVar19 = btMultiBody::getBaseCollider(local_240);
    if (pbVar19 != (btMultiBodyLinkCollider *)0x0) {
      pbVar20 = (btCollisionObject *)btMultiBody::getBaseCollider(local_240);
      iVar10 = btCollisionObject::getActivationState(pbVar20);
      if (iVar10 == 2) {
        local_241 = 1;
      }
    }
    local_248 = 0;
    while (iVar10 = local_248, iVar9 = btMultiBody::getNumLinks((btMultiBody *)0x24f60f),
          iVar10 < iVar9) {
      pbVar18 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
      if (pbVar18->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar18 = btMultiBody::getLink(in_stack_fffffffffffffa10,(int)((ulong)name >> 0x20));
        iVar10 = btCollisionObject::getActivationState((btCollisionObject *)pbVar18->m_collider);
        if (iVar10 == 2) {
          local_241 = 1;
        }
      }
      local_248 = local_248 + 1;
    }
    if ((local_241 & 1) == 0) {
      btMultiBody::getNumLinks((btMultiBody *)0x24f6c5);
      local_24c = 0;
      btAlignedObjectArray<float>::resize
                ((btAlignedObjectArray<float> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,
                 (float *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      in_stack_fffffffffffffa34 = btMultiBody::getNumLinks((btMultiBody *)0x24f700);
      in_stack_fffffffffffffa30 = in_stack_fffffffffffffa34 + 1;
      btVector3::btVector3(&local_25c);
      btAlignedObjectArray<btVector3>::resize
                ((btAlignedObjectArray<btVector3> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      in_stack_fffffffffffffa2c = btMultiBody::getNumLinks((btMultiBody *)0x24f747);
      btMatrix3x3::btMatrix3x3
                ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      btAlignedObjectArray<btMatrix3x3>::resize
                ((btAlignedObjectArray<btMatrix3x3> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,
                 (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      bVar8 = btMultiBody::isUsingRK4Integration(local_240);
      in_stack_fffffffffffffa24 = (btScalar)CONCAT13(bVar8,SUB43(in_stack_fffffffffffffa24,0));
      if (!bVar8) {
        btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                  (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                   in_stack_00000718,(bool)in_stack_00000717);
      }
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x24f810);
  local_294 = 0;
  while (iVar10 = local_294,
        iVar9 = btAlignedObjectArray<btMultiBody_*>::size
                          ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1)), iVar10 < iVar9) {
    btAlignedObjectArray<btMultiBody_*>::operator[]
              ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1),local_294);
    btMultiBody::processDeltaVeeMultiDof2((btMultiBody *)CONCAT44(in_stack_fffffffffffffa24,iVar9));
    local_294 = local_294 + 1;
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x24f8b2);
  btAlignedObjectArray<btMatrix3x3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btMatrix3x3> *)0x24f8bf);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x24f8cc);
  btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x24f8d9);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::solveConstraints(btContactSolverInfo& solverInfo)
{
	forwardKinematics();

	btAlignedObjectArray<btScalar> scratch_r;
	btAlignedObjectArray<btVector3> scratch_v;
	btAlignedObjectArray<btMatrix3x3> scratch_m;


	BT_PROFILE("solveConstraints");
	
	m_sortedConstraints.resize( m_constraints.size());
	int i; 
	for (i=0;i<getNumConstraints();i++)
	{
		m_sortedConstraints[i] = m_constraints[i];
	}
	m_sortedConstraints.quickSort(btSortConstraintOnIslandPredicate2());
	btTypedConstraint** constraintsPtr = getNumConstraints() ? &m_sortedConstraints[0] : 0;

	m_sortedMultiBodyConstraints.resize(m_multiBodyConstraints.size());
	for (i=0;i<m_multiBodyConstraints.size();i++)
	{
		m_sortedMultiBodyConstraints[i] = m_multiBodyConstraints[i];
	}
	m_sortedMultiBodyConstraints.quickSort(btSortMultiBodyConstraintOnIslandPredicate());

	btMultiBodyConstraint** sortedMultiBodyConstraints = m_sortedMultiBodyConstraints.size() ?  &m_sortedMultiBodyConstraints[0] : 0;
	

	m_solverMultiBodyIslandCallback->setup(&solverInfo,constraintsPtr,m_sortedConstraints.size(),sortedMultiBodyConstraints,m_sortedMultiBodyConstraints.size(), getDebugDrawer());
	m_constraintSolver->prepareSolve(getCollisionWorld()->getNumCollisionObjects(), getCollisionWorld()->getDispatcher()->getNumManifolds());
	
	/// solve all the constraints for this island
	m_islandManager->buildAndProcessIslands(getCollisionWorld()->getDispatcher(),getCollisionWorld(),m_solverMultiBodyIslandCallback);

#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	{
		BT_PROFILE("btMultiBody addForce");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);

				bod->addBaseForce(m_gravity * bod->getBaseMass());

				for (int j = 0; j < bod->getNumLinks(); ++j) 
				{
					bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
				}
			}//if (!isSleeping)
		}
	}
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	

	{
		BT_PROFILE("btMultiBody stepVelocities");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);
				bool doNotUpdatePos = false;

				{
					if(!bod->isUsingRK4Integration())
					{
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m);
					}
					else
					{						
						//
						int numDofs = bod->getNumDofs() + 6;
						int numPosVars = bod->getNumPosVars() + 7;
						btAlignedObjectArray<btScalar> scratch_r2; scratch_r2.resize(2*numPosVars + 8*numDofs);
						//convenience
						btScalar *pMem = &scratch_r2[0];
						btScalar *scratch_q0 = pMem; pMem += numPosVars;
						btScalar *scratch_qx = pMem; pMem += numPosVars;
						btScalar *scratch_qd0 = pMem; pMem += numDofs;
						btScalar *scratch_qd1 = pMem; pMem += numDofs;
						btScalar *scratch_qd2 = pMem; pMem += numDofs;
						btScalar *scratch_qd3 = pMem; pMem += numDofs;
						btScalar *scratch_qdd0 = pMem; pMem += numDofs;
						btScalar *scratch_qdd1 = pMem; pMem += numDofs;
						btScalar *scratch_qdd2 = pMem; pMem += numDofs;
						btScalar *scratch_qdd3 = pMem; pMem += numDofs;
						btAssert((pMem - (2*numPosVars + 8*numDofs)) == &scratch_r2[0]);

						/////						
						//copy q0 to scratch_q0 and qd0 to scratch_qd0
						scratch_q0[0] = bod->getWorldToBaseRot().x();
						scratch_q0[1] = bod->getWorldToBaseRot().y();
						scratch_q0[2] = bod->getWorldToBaseRot().z();
						scratch_q0[3] = bod->getWorldToBaseRot().w();
						scratch_q0[4] = bod->getBasePos().x();
						scratch_q0[5] = bod->getBasePos().y();
						scratch_q0[6] = bod->getBasePos().z();
						//
						for(int link = 0; link < bod->getNumLinks(); ++link)
						{
							for(int dof = 0; dof < bod->getLink(link).m_posVarCount; ++dof)
								scratch_q0[7 + bod->getLink(link).m_cfgOffset + dof] = bod->getLink(link).m_jointPos[dof];							
						}
						//
						for(int dof = 0; dof < numDofs; ++dof)								
							scratch_qd0[dof] = bod->getVelocityVector()[dof];
						////
						struct
						{
						    btMultiBody *bod;
                            btScalar *scratch_qx, *scratch_q0;

						    void operator()()
						    {
						        for(int dof = 0; dof < bod->getNumPosVars() + 7; ++dof)
                                    scratch_qx[dof] = scratch_q0[dof];
						    }
						} pResetQx = {bod, scratch_qx, scratch_q0};
						//
						struct
						{
						    void operator()(btScalar dt, const btScalar *pDer, const btScalar *pCurVal, btScalar *pVal, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pVal[i] = pCurVal[i] + dt * pDer[i];
						    }

						} pEulerIntegrate;
						//
						struct
                        {
                            void operator()(btMultiBody *pBody, const btScalar *pData)
                            {
                                btScalar *pVel = const_cast<btScalar*>(pBody->getVelocityVector());

                                for(int i = 0; i < pBody->getNumDofs() + 6; ++i)
                                    pVel[i] = pData[i];

                            }
                        } pCopyToVelocityVector;
						//
                        struct
						{
						    void operator()(const btScalar *pSrc, btScalar *pDst, int start, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pDst[i] = pSrc[start + i];
						    }
						} pCopy;
						//

						btScalar h = solverInfo.m_timeStep;
						#define output &scratch_r[bod->getNumDofs()]
						//calc qdd0 from: q0 & qd0	
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd0, 0, numDofs);
						//calc q1 = q0 + h/2 * qd0
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd0);
						//calc qd1 = qd0 + h/2 * qdd0
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd0, scratch_qd0, scratch_qd1, numDofs);
						//
						//calc qdd1 from: q1 & qd1
						pCopyToVelocityVector(bod, scratch_qd1);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd1, 0, numDofs);
						//calc q2 = q0 + h/2 * qd1
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd1);
						//calc qd2 = qd0 + h/2 * qdd1
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd1, scratch_qd0, scratch_qd2, numDofs);
						//
						//calc qdd2 from: q2 & qd2
						pCopyToVelocityVector(bod, scratch_qd2);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd2, 0, numDofs);
						//calc q3 = q0 + h * qd2
						pResetQx();
						bod->stepPositionsMultiDof(h, scratch_qx, scratch_qd2);
						//calc qd3 = qd0 + h * qdd2
						pEulerIntegrate(h, scratch_qdd2, scratch_qd0, scratch_qd3, numDofs);
						//
						//calc qdd3 from: q3 & qd3
						pCopyToVelocityVector(bod, scratch_qd3);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd3, 0, numDofs);

						//
						//calc q = q0 + h/6(qd0 + 2*(qd1 + qd2) + qd3)
						//calc qd = qd0 + h/6(qdd0 + 2*(qdd1 + qdd2) + qdd3)						
						btAlignedObjectArray<btScalar> delta_q; delta_q.resize(numDofs);
						btAlignedObjectArray<btScalar> delta_qd; delta_qd.resize(numDofs);
						for(int i = 0; i < numDofs; ++i)
						{
							delta_q[i] = h/btScalar(6.)*(scratch_qd0[i] + 2*scratch_qd1[i] + 2*scratch_qd2[i] + scratch_qd3[i]);
							delta_qd[i] = h/btScalar(6.)*(scratch_qdd0[i] + 2*scratch_qdd1[i] + 2*scratch_qdd2[i] + scratch_qdd3[i]);							
							//delta_q[i] = h*scratch_qd0[i];
							//delta_qd[i] = h*scratch_qdd0[i];
						}
						//
						pCopyToVelocityVector(bod, scratch_qd0);
						bod->applyDeltaVeeMultiDof(&delta_qd[0], 1);						
						//
						if(!doNotUpdatePos)
						{
							btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
							pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

							for(int i = 0; i < numDofs; ++i)
								pRealBuf[i] = delta_q[i];

							//bod->stepPositionsMultiDof(1, 0, &delta_q[0]);
							bod->setPosUpdated(true);							
						}

						//ugly hack which resets the cached data to t0 (needed for constraint solver)
						{
							for(int link = 0; link < bod->getNumLinks(); ++link)
								bod->getLink(link).updateCacheMultiDof();
							bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0, scratch_r, scratch_v, scratch_m);
						}
						
					}
				}
				
#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
				bod->clearForcesAndTorques();
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
			}//if (!isSleeping)
		}
	}

	clearMultiBodyConstraintForces();

	m_solverMultiBodyIslandCallback->processConstraints();
	
	m_constraintSolver->allSolved(solverInfo, m_debugDrawer);

	{
                BT_PROFILE("btMultiBody stepVelocities");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                                //useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
                                scratch_r.resize(bod->getNumLinks()+1);                 //multidof? ("Y"s use it and it is used to store qdd)
                                scratch_v.resize(bod->getNumLinks()+1);
                                scratch_m.resize(bod->getNumLinks()+1);

                                
                            {
                                if(!bod->isUsingRK4Integration())
                                {
									bool isConstraintPass = true;
                                    bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m, isConstraintPass);
                                }
				}
			}
		}
	}

	for (int i=0;i<this->m_multiBodies.size();i++)
	{
		btMultiBody* bod = m_multiBodies[i];
		bod->processDeltaVeeMultiDof2();
	}

}